

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O1

bool xercesc_4_0::XMLChar1_1::containsWhiteSpace(XMLCh *toCheck,XMLSize_t count)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  
  if (count == 0) {
    return false;
  }
  pXVar1 = toCheck + count;
  do {
    if (toCheck >= pXVar1) {
      return toCheck < pXVar1;
    }
    XVar2 = *toCheck;
    toCheck = toCheck + 1;
  } while (-1 < (char)(&fgCharCharsTable1_1)[(ushort)XVar2]);
  return true;
}

Assistant:

bool XMLChar1_1::containsWhiteSpace(const   XMLCh* const    toCheck
                                    , const XMLSize_t       count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    while (curCh < endPtr)
    {
        if (fgCharCharsTable1_1[*curCh++] & gWhitespaceCharMask)
            return true;
    }
    return false;
}